

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O1

void __thiscall logger::OutputWorker::Start(OutputWorker *this)

{
  list<logger::OutputWorker::QueuedMessage,_std::allocator<logger::OutputWorker::QueuedMessage>_>
  *plVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  thread *ptVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  int iVar4;
  undefined1 local_49;
  thread *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  OutputWorker *local_30;
  code *local_28;
  undefined8 local_20;
  
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar4 == 0) {
    if ((this->Thread).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      plVar1 = &this->QueuePublic;
      std::__cxx11::
      _List_base<logger::OutputWorker::QueuedMessage,_std::allocator<logger::OutputWorker::QueuedMessage>_>
      ::_M_clear(&plVar1->
                  super__List_base<logger::OutputWorker::QueuedMessage,_std::allocator<logger::OutputWorker::QueuedMessage>_>
                );
      (this->QueuePublic).
      super__List_base<logger::OutputWorker::QueuedMessage,_std::allocator<logger::OutputWorker::QueuedMessage>_>
      ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
      (this->QueuePublic).
      super__List_base<logger::OutputWorker::QueuedMessage,_std::allocator<logger::OutputWorker::QueuedMessage>_>
      ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
      (this->QueuePublic).
      super__List_base<logger::OutputWorker::QueuedMessage,_std::allocator<logger::OutputWorker::QueuedMessage>_>
      ._M_impl._M_node._M_size = 0;
      plVar1 = &this->QueuePrivate;
      std::__cxx11::
      _List_base<logger::OutputWorker::QueuedMessage,_std::allocator<logger::OutputWorker::QueuedMessage>_>
      ::_M_clear(&plVar1->
                  super__List_base<logger::OutputWorker::QueuedMessage,_std::allocator<logger::OutputWorker::QueuedMessage>_>
                );
      (this->QueuePrivate).
      super__List_base<logger::OutputWorker::QueuedMessage,_std::allocator<logger::OutputWorker::QueuedMessage>_>
      ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
      (this->QueuePrivate).
      super__List_base<logger::OutputWorker::QueuedMessage,_std::allocator<logger::OutputWorker::QueuedMessage>_>
      ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
      (this->QueuePrivate).
      super__List_base<logger::OutputWorker::QueuedMessage,_std::allocator<logger::OutputWorker::QueuedMessage>_>
      ._M_impl._M_node._M_size = 0;
      LOCK();
      (this->Overrun).super___atomic_base<int>._M_i = 0;
      UNLOCK();
      LOCK();
      (this->FlushRequested)._M_base._M_i = false;
      UNLOCK();
      LOCK();
      (this->Terminated)._M_base._M_i = false;
      UNLOCK();
      local_28 = Loop;
      local_20 = 0;
      local_48 = (element_type *)0x0;
      local_30 = this;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<std::thread,std::allocator<std::thread>,void(logger::OutputWorker::*)(),logger::OutputWorker*>
                (a_Stack_40,&local_48,(allocator<std::thread> *)&local_49,
                 (offset_in_OutputWorker_to_subr *)&local_28,&local_30);
      _Var3._M_pi = a_Stack_40[0]._M_pi;
      ptVar2 = local_48;
      local_48 = (thread *)0x0;
      a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_00 = (this->Thread).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      (this->Thread).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr = ptVar2;
      (this->Thread).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var3._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  std::__throw_system_error(iVar4);
}

Assistant:

void OutputWorker::Start()
{
    std::lock_guard<std::mutex> locker(StartStopLock);

    // If thread is already spinning:
    if (Thread)
        return;

#if defined(_WIN32)
    CachedIsDebuggerPresent = (::IsDebuggerPresent() != FALSE);
#endif // _WIN32

    QueuePublic.clear();
    QueuePrivate.clear();

#if !defined(LOGGER_NEVER_DROP)
    Overrun = 0;
#endif // LOGGER_NEVER_DROP
    FlushRequested = false;
    Terminated = false;
    Thread = std::make_shared<std::thread>(&OutputWorker::Loop, this);

#if defined(_WIN32)
    ThreadNativeHandle = Thread->native_handle();
#endif // _WIN32
}